

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.h
# Opt level: O0

void mempool_create(mempool *pool,slab_cache *cache,uint32_t objsize)

{
  byte order_00;
  double dVar1;
  undefined1 auVar2 [16];
  ulong local_40;
  ulong uStack_30;
  uint8_t order;
  size_t slab_size;
  size_t overhead;
  uint32_t objsize_local;
  slab_cache *cache_local;
  mempool *pool_local;
  
  if (objsize < 0x71) {
    local_40 = 0x70;
  }
  else {
    local_40 = (ulong)objsize;
  }
  auVar2._8_4_ = 0;
  auVar2._0_8_ = local_40;
  auVar2._12_4_ = 0x45300000;
  dVar1 = ((auVar2._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_40) - 4503599627370496.0)) / 0.01;
  uStack_30 = (ulong)dVar1;
  uStack_30 = uStack_30 | (long)(dVar1 - 9.223372036854776e+18) & (long)uStack_30 >> 0x3f;
  if (cache->arena->slab_size < uStack_30) {
    uStack_30 = (ulong)cache->arena->slab_size;
  }
  order_00 = slab_order(cache,uStack_30);
  if (order_00 <= cache->order_max) {
    mempool_create_with_order(pool,cache,objsize,order_00);
    return;
  }
  __assert_fail("order <= cache->order_max",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/mempool.h"
                ,0xfe,"void mempool_create(struct mempool *, struct slab_cache *, uint32_t)");
}

Assistant:

static inline void
mempool_create(struct mempool *pool, struct slab_cache *cache,
	       uint32_t objsize)
{
	size_t overhead = (objsize > sizeof(struct mslab) ?
			   objsize : sizeof(struct mslab));
	size_t slab_size = (size_t) (overhead / OVERHEAD_RATIO);
	if (slab_size > cache->arena->slab_size)
		slab_size = cache->arena->slab_size;
	/*
	 * Calculate the amount of usable space in a slab.
	 * @note: this asserts that slab_size_min is less than
	 * SLAB_ORDER_MAX.
	 */
	uint8_t order = slab_order(cache, slab_size);
	assert(order <= cache->order_max);
	return mempool_create_with_order(pool, cache, objsize, order);
}